

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

void __thiscall ChebTools::LMatrixLibrary::build(LMatrixLibrary *this,size_t N)

{
  undefined1 auVar1 [16];
  ActualDstType actualDst;
  mapped_type *dst;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  MatrixXd L;
  assign_op<double,_double> local_b1;
  int local_b0;
  int local_ac;
  DenseStorage<double,__1,__1,__1,_0> local_a8;
  double local_90;
  double local_88;
  size_t local_80;
  size_t local_78;
  longdouble local_6c;
  longdouble local_60;
  longdouble local_54;
  double local_48;
  double dStack_40;
  
  uVar3 = N + 1;
  local_a8.m_data = (double *)0x0;
  local_a8.m_rows = 0;
  local_a8.m_cols = 0;
  local_78 = N;
  if ((long)uVar3 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((uVar3 != 0) &&
     (auVar1._8_8_ = 0, auVar1._0_8_ = uVar3,
     auVar8 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff), SUB168(auVar8 / auVar1,0) < uVar3))
  {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8,N,SUB168(auVar8 % auVar1,0));
    *puVar2 = std::random_device::_M_fini;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_a8,uVar3 * uVar3,uVar3,uVar3);
  local_60 = (longdouble)(long)N + (longdouble)*(float *)(&DAT_001a48c8 + (ulong)((long)N < 0) * 4);
  auVar8._8_4_ = (int)(N >> 0x20);
  auVar8._0_8_ = N;
  auVar8._12_4_ = 0x45300000;
  dStack_40 = auVar8._8_8_ - 1.9342813113834067e+25;
  local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)N) - 4503599627370496.0);
  lVar5 = 0;
  local_6c = _DAT_001a4990;
  uVar3 = 0;
  local_80 = N;
  do {
    local_ac = (int)uVar3;
    local_54 = local_6c * (longdouble)local_ac;
    local_90 = 2.0;
    uVar4 = uVar3;
    if (uVar3 != 0) {
      local_90 = *(double *)(&DAT_001a49a0 + (ulong)(uVar3 == N) * 8);
    }
    do {
      local_b0 = (int)uVar4;
      local_88 = (double)((local_54 * (longdouble)local_b0) / local_60);
      dVar7 = cos(local_88);
      if ((local_a8.m_rows <= (long)uVar3) || (local_a8.m_cols <= (long)uVar4)) {
LAB_00136ea0:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      dVar9 = 2.0;
      if (uVar4 != 0) {
        dVar9 = *(double *)(&DAT_001a49a0 + (ulong)(N == uVar4) * 8);
      }
      dVar7 = (2.0 / (dVar9 * local_90 * local_48)) * dVar7;
      local_a8.m_data[local_a8.m_rows * uVar4 + uVar3] = dVar7;
      if ((local_a8.m_rows <= (long)uVar4) || (local_a8.m_cols <= (long)uVar3)) goto LAB_00136ea0;
      *(double *)((long)local_a8.m_data + uVar4 * 8 + local_a8.m_rows * lVar5) = dVar7;
      bVar6 = uVar4 < N;
      uVar4 = uVar4 + 1;
    } while (bVar6);
    lVar5 = lVar5 + 8;
    bVar6 = N <= uVar3;
    uVar3 = uVar3 + 1;
    if (bVar6) {
      dst = std::
            map<unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
            ::operator[](&this->matrices,&local_78);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (dst,(Matrix<double,__1,__1,_0,__1,__1> *)&local_a8,&local_b1);
      free(local_a8.m_data);
      return;
    }
  } while( true );
}

Assistant:

void build(std::size_t N) {
            Eigen::MatrixXd L(N + 1, N + 1); ///< Matrix of coefficients
            for (int j = 0; j <= N; ++j) {
                for (int k = j; k <= N; ++k) {
                    double p_j = (j == 0 || j == N) ? 2 : 1;
                    double p_k = (k == 0 || k == N) ? 2 : 1;
                    L(j, k) = 2.0 / (p_j*p_k*N)*cos((j*EIGEN_PI*k) / N);
                    // Exploit symmetry to fill in the symmetric elements in the matrix
                    L(k, j) = L(j, k);
                }
            }
            matrices[N] = L;
        }